

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O0

void lateLoadDefaultConverters(void)

{
  int iVar1;
  allocator *in_stack_ffffffffffffefb0;
  allocator *in_stack_ffffffffffffefb8;
  allocator *in_stack_ffffffffffffefc0;
  allocator *in_stack_ffffffffffffefc8;
  allocator *in_stack_ffffffffffffefd0;
  allocator local_dc9;
  string local_dc8 [39];
  allocator local_da1;
  string local_da0 [32];
  undefined4 local_d80;
  allocator local_d79;
  string local_d78 [39];
  allocator local_d51;
  string local_d50 [32];
  undefined4 local_d30;
  allocator local_d29;
  string local_d28 [39];
  allocator local_d01;
  string local_d00 [32];
  undefined4 local_ce0;
  allocator local_cd9;
  string local_cd8 [39];
  allocator local_cb1;
  string local_cb0 [32];
  undefined4 local_c90;
  allocator local_c89;
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [32];
  undefined4 local_c40;
  allocator local_c39;
  string local_c38 [39];
  allocator local_c11;
  string local_c10 [32];
  undefined4 local_bf0;
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [32];
  undefined4 local_ba0;
  allocator local_b99;
  string local_b98 [39];
  allocator local_b71;
  string local_b70 [32];
  undefined4 local_b50;
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [32];
  undefined4 local_b00;
  allocator local_af9;
  string local_af8 [39];
  allocator local_ad1;
  string local_ad0 [32];
  undefined4 local_ab0;
  allocator local_aa9;
  string local_aa8 [39];
  allocator local_a81;
  string local_a80 [32];
  undefined4 local_a60;
  allocator local_a59;
  string local_a58 [39];
  allocator local_a31;
  string local_a30 [32];
  undefined4 local_a10;
  allocator local_a09;
  string local_a08 [39];
  allocator local_9e1;
  string local_9e0 [32];
  undefined4 local_9c0;
  allocator local_9b9;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [32];
  undefined4 local_970;
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [32];
  undefined4 local_920;
  allocator local_919;
  string local_918 [39];
  allocator local_8f1;
  string local_8f0 [32];
  undefined4 local_8d0;
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [32];
  undefined4 local_880;
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [32];
  undefined4 local_830;
  allocator local_829;
  string local_828 [39];
  allocator local_801;
  string local_800 [32];
  undefined4 local_7e0;
  allocator local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  undefined4 local_790;
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [32];
  undefined4 local_740;
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [32];
  undefined4 local_6f0;
  allocator local_6e9;
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [32];
  undefined4 local_6a0;
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [32];
  undefined4 local_650;
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [32];
  undefined4 local_600;
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [32];
  undefined4 local_5b0;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  undefined4 local_560;
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [32];
  undefined4 local_510;
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [32];
  undefined4 local_4c0;
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [32];
  undefined4 local_470;
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [32];
  undefined4 local_420;
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  undefined4 local_3d0;
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  undefined4 local_380;
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [32];
  undefined4 local_330;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  undefined4 local_2e0;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  undefined4 local_290;
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  undefined4 local_240;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  undefined4 local_1f0;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  undefined4 local_1a0;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  undefined4 local_150;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  undefined4 local_60;
  allocator local_59;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  if (lateLoadDefaultConverters()::registerGenericF32toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,"F32",&local_21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"F32",&local_59);
      local_60 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      std::__cxx11::string::~string(local_20);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS32toS32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS32toS32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"S32",&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"S32",&local_a9);
      local_b0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS32toS32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"S16",&local_d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"S16",&local_f9);
      local_100 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"S8",&local_121);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"S8",&local_149);
      local_150 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"F32",&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"S16",&local_199);
      local_1a0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"S16",&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"F32",&local_1e9);
      local_1f0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"F32",&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"U16",&local_239);
      local_240 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"U16",&local_261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"F32",&local_289);
      local_290 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"F32",&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"S8",&local_2d9);
      local_2e0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"S8",&local_301);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_328,"F32",&local_329);
      local_330 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toU8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"F32",&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,"U8",&local_379);
      local_380 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,"U8",&local_3a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c8,"F32",&local_3c9);
      local_3d0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"S16",&local_3f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"U16",&local_419);
      local_420 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,"U16",&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"S16",&local_469);
      local_470 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_490,"S16",&local_491);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b8,"S8",&local_4b9);
      local_4c0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      std::__cxx11::string::~string(local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e0,"S8",&local_4e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_508,"S16",&local_509);
      local_510 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_508);
      std::allocator<char>::~allocator((allocator<char> *)&local_509);
      std::__cxx11::string::~string(local_4e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toU8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_530,"S16",&local_531);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_558,"U8",&local_559);
      local_560 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator((allocator<char> *)&local_559);
      std::__cxx11::string::~string(local_530);
      std::allocator<char>::~allocator((allocator<char> *)&local_531);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,"U8",&local_581);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"S16",&local_5a9);
      local_5b0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,"U16",&local_5d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f8,"S8",&local_5f9);
      local_600 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_620,"S8",&local_621);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,"U16",&local_649);
      local_650 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      std::__cxx11::string::~string(local_620);
      std::allocator<char>::~allocator((allocator<char> *)&local_621);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toU8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,"S8",&local_671);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_698,"U8",&local_699);
      local_6a0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_698);
      std::allocator<char>::~allocator((allocator<char> *)&local_699);
      std::__cxx11::string::~string(local_670);
      std::allocator<char>::~allocator((allocator<char> *)&local_671);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c0,"U8",&local_6c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"S8",&local_6e9);
      local_6f0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_6e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
      std::__cxx11::string::~string(local_6c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_710,"CF32",&local_711);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"CF32",&local_739);
      local_740 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
      std::__cxx11::string::~string(local_710);
      std::allocator<char>::~allocator((allocator<char> *)&local_711);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS32toCS32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS32toCS32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"CS32",&local_761);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"CS32",&local_789);
      local_790 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      std::__cxx11::string::~string(local_760);
      std::allocator<char>::~allocator((allocator<char> *)&local_761);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS32toCS32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b0,"CS16",&local_7b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d8,"CS16",&local_7d9);
      local_7e0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      std::__cxx11::string::~string(local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_800,"CS8",&local_801);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_828,"CS8",&local_829);
      local_830 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
      std::__cxx11::string::~string(local_800);
      std::allocator<char>::~allocator((allocator<char> *)&local_801);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_850,"CF32",&local_851);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_878,"CS16",&local_879);
      local_880 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_878);
      std::allocator<char>::~allocator((allocator<char> *)&local_879);
      std::__cxx11::string::~string(local_850);
      std::allocator<char>::~allocator((allocator<char> *)&local_851);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8a0,"CS16",&local_8a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,"CF32",&local_8c9);
      local_8d0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_8c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
      std::__cxx11::string::~string(local_8a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8f0,"CF32",&local_8f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_918,"CU16",&local_919);
      local_920 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_918);
      std::allocator<char>::~allocator((allocator<char> *)&local_919);
      std::__cxx11::string::~string(local_8f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_940,"CU16",&local_941);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_968,"CF32",&local_969);
      local_970 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
      std::__cxx11::string::~string(local_940);
      std::allocator<char>::~allocator((allocator<char> *)&local_941);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_990,"CF32",&local_991);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b8,"CS8",&local_9b9);
      local_9c0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_9b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
      std::__cxx11::string::~string(local_990);
      std::allocator<char>::~allocator((allocator<char> *)&local_991);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9e0,"CS8",&local_9e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a08,"CF32",&local_a09);
      local_a10 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_a08);
      std::allocator<char>::~allocator((allocator<char> *)&local_a09);
      std::__cxx11::string::~string(local_9e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCU8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a30,"CF32",&local_a31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a58,"CU8",&local_a59);
      local_a60 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_a58);
      std::allocator<char>::~allocator((allocator<char> *)&local_a59);
      std::__cxx11::string::~string(local_a30);
      std::allocator<char>::~allocator((allocator<char> *)&local_a31);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCF32);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a80,"CU8",&local_a81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,"CF32",&local_aa9);
      local_ab0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_aa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
      std::__cxx11::string::~string(local_a80);
      std::allocator<char>::~allocator((allocator<char> *)&local_a81);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ad0,"CS16",&local_ad1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_af8,"CU16",&local_af9);
      local_b00 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_af8);
      std::allocator<char>::~allocator((allocator<char> *)&local_af9);
      std::__cxx11::string::~string(local_ad0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b20,"CU16",&local_b21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b48,"CS16",&local_b49);
      local_b50 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_b48);
      std::allocator<char>::~allocator((allocator<char> *)&local_b49);
      std::__cxx11::string::~string(local_b20);
      std::allocator<char>::~allocator((allocator<char> *)&local_b21);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b70,"CS16",&local_b71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b98,"CS8",&local_b99);
      local_ba0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_b98);
      std::allocator<char>::~allocator((allocator<char> *)&local_b99);
      std::__cxx11::string::~string(local_b70);
      std::allocator<char>::~allocator((allocator<char> *)&local_b71);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCS16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bc0,"CS8",&local_bc1);
      in_stack_ffffffffffffefd0 = &local_be9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_be8,"CS16",in_stack_ffffffffffffefd0);
      local_bf0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_be8);
      std::allocator<char>::~allocator((allocator<char> *)&local_be9);
      std::__cxx11::string::~string(local_bc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCU8);
    if (iVar1 != 0) {
      in_stack_ffffffffffffefc8 = &local_c11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c10,"CS16",in_stack_ffffffffffffefc8);
      in_stack_ffffffffffffefc0 = &local_c39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c38,"CU8",in_stack_ffffffffffffefc0);
      local_c40 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_c38);
      std::allocator<char>::~allocator((allocator<char> *)&local_c39);
      std::__cxx11::string::~string(local_c10);
      std::allocator<char>::~allocator((allocator<char> *)&local_c11);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCS16);
    if (iVar1 != 0) {
      in_stack_ffffffffffffefb8 = &local_c61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c60,"CU8",in_stack_ffffffffffffefb8);
      in_stack_ffffffffffffefb0 = &local_c89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c88,"CS16",in_stack_ffffffffffffefb0);
      local_c90 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_c88);
      std::allocator<char>::~allocator((allocator<char> *)&local_c89);
      std::__cxx11::string::~string(local_c60);
      std::allocator<char>::~allocator((allocator<char> *)&local_c61);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb0,"CU16",&local_cb1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cd8,"CS8",&local_cd9);
      local_ce0 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_cd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
      std::__cxx11::string::~string(local_cb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCU16);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d00,"CS8",&local_d01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d28,"CU16",&local_d29);
      local_d30 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_d28);
      std::allocator<char>::~allocator((allocator<char> *)&local_d29);
      std::__cxx11::string::~string(local_d00);
      std::allocator<char>::~allocator((allocator<char> *)&local_d01);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCU8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d50,"CS8",&local_d51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d78,"CU8",&local_d79);
      local_d80 = 0;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_d78);
      std::allocator<char>::~allocator((allocator<char> *)&local_d79);
      std::__cxx11::string::~string(local_d50);
      std::allocator<char>::~allocator((allocator<char> *)&local_d51);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCS8);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_da0,"CU8",&local_da1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_dc8,"CS8",&local_dc9);
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8,
                 (string *)in_stack_ffffffffffffefc0,(FunctionPriority *)in_stack_ffffffffffffefb8,
                 (ConverterFunction)in_stack_ffffffffffffefb0);
      std::__cxx11::string::~string(local_dc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
      std::__cxx11::string::~string(local_da0);
      std::allocator<char>::~allocator((allocator<char> *)&local_da1);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCS8);
    }
  }
  return;
}

Assistant:

void lateLoadDefaultConverters(void)
{
    static SoapySDR::ConverterRegistry registerGenericF32toF32(SOAPY_SDR_F32, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericF32toF32);
    static SoapySDR::ConverterRegistry registerGenericS32toS32(SOAPY_SDR_S32, SOAPY_SDR_S32, SoapySDR::ConverterRegistry::GENERIC, &genericS32toS32);
    static SoapySDR::ConverterRegistry registerGenericS16toS16(SOAPY_SDR_S16, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericS16toS16);
    static SoapySDR::ConverterRegistry registerGenericS8toS8(SOAPY_SDR_S8, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericS8toS8);
    static SoapySDR::ConverterRegistry registerGenericF32toS16(SOAPY_SDR_F32, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericF32toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toF32(SOAPY_SDR_S16, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericS16toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toU16(SOAPY_SDR_F32, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericF32toU16);
    static SoapySDR::ConverterRegistry registerGenericU16toF32(SOAPY_SDR_U16, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericU16toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toS8(SOAPY_SDR_F32, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericF32toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toF32(SOAPY_SDR_S8, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericS8toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toU8(SOAPY_SDR_F32, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericF32toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toF32(SOAPY_SDR_U8, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericU8toF32);
    static SoapySDR::ConverterRegistry registerGenericS16toU16(SOAPY_SDR_S16, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericS16toU16);
    static SoapySDR::ConverterRegistry registerGenericU16toS16(SOAPY_SDR_U16, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericU16toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toS8(SOAPY_SDR_S16, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericS16toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toS16(SOAPY_SDR_S8, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericS8toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toU8(SOAPY_SDR_S16, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericS16toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toS16(SOAPY_SDR_U8, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericU8toS16);
    static SoapySDR::ConverterRegistry registerGenericU16toS8(SOAPY_SDR_U16, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericU16toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toU16(SOAPY_SDR_S8, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericS8toU16);
    static SoapySDR::ConverterRegistry registerGenericS8toU8(SOAPY_SDR_S8, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericS8toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toS8(SOAPY_SDR_U8, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericU8toS8);
    static SoapySDR::ConverterRegistry registerGenericCF32toCF32(SOAPY_SDR_CF32, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCF32);
    static SoapySDR::ConverterRegistry registerGenericCS32toCS32(SOAPY_SDR_CS32, SOAPY_SDR_CS32, SoapySDR::ConverterRegistry::GENERIC, &genericCS32toCS32);
    static SoapySDR::ConverterRegistry registerGenericCS16toCS16(SOAPY_SDR_CS16, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS8toCS8(SOAPY_SDR_CS8, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCS8);
    static SoapySDR::ConverterRegistry registerGenericCF32toCS16(SOAPY_SDR_CF32, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCF32(SOAPY_SDR_CS16, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCU16(SOAPY_SDR_CF32, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCU16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCF32(SOAPY_SDR_CU16, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCS8(SOAPY_SDR_CF32, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCF32(SOAPY_SDR_CS8, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCU8(SOAPY_SDR_CF32, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCF32(SOAPY_SDR_CU8, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCF32);
    static SoapySDR::ConverterRegistry registerGenericCS16toCU16(SOAPY_SDR_CS16, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCU16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCS16(SOAPY_SDR_CU16, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCS8(SOAPY_SDR_CS16, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCS16(SOAPY_SDR_CS8, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCU8(SOAPY_SDR_CS16, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCS16(SOAPY_SDR_CU8, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCS16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCS8(SOAPY_SDR_CU16, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCU16(SOAPY_SDR_CS8, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCU16);
    static SoapySDR::ConverterRegistry registerGenericCS8toCU8(SOAPY_SDR_CS8, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCS8(SOAPY_SDR_CU8, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCS8);
}